

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::HttpClient::WebSocketResponse>::ExceptionOr
          (ExceptionOr<kj::HttpClient::WebSocketResponse> *this,WebSocketResponse *value)

{
  WebSocketResponse *t;
  WebSocketResponse *value_local;
  ExceptionOr<kj::HttpClient::WebSocketResponse> *this_local;
  
  ExceptionOrValue::ExceptionOrValue(&this->super_ExceptionOrValue);
  t = mv<kj::HttpClient::WebSocketResponse>(value);
  Maybe<kj::HttpClient::WebSocketResponse>::Maybe(&this->value,t);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}